

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_manager.cpp
# Opt level: O2

void __thiscall miniros::RPCManager::unbind(RPCManager *this,string *function_name)

{
  LOCK();
  (this->unbind_requested_)._M_base._M_i = true;
  UNLOCK();
  std::mutex::lock(&this->functions_mutex_);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_miniros::RPCManager::FunctionInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_miniros::RPCManager::FunctionInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_miniros::RPCManager::FunctionInfo>_>_>
  ::erase(&(this->functions_)._M_t,function_name);
  LOCK();
  (this->unbind_requested_)._M_base._M_i = false;
  UNLOCK();
  pthread_mutex_unlock((pthread_mutex_t *)&this->functions_mutex_);
  return;
}

Assistant:

void RPCManager::unbind(const std::string& function_name)
{
  unbind_requested_ = true;
  std::scoped_lock<std::mutex> lock(functions_mutex_);
  functions_.erase(function_name);
  unbind_requested_ = false;
}